

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

MatchesClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MatchesClauseSyntax,slang::parsing::Token&,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,Token *args,PatternSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  MatchesClauseSyntax *pMVar6;
  
  pMVar6 = (MatchesClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MatchesClauseSyntax *)this->endPtr < pMVar6 + 1) {
    pMVar6 = (MatchesClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pMVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pMVar6->super_SyntaxNode).kind = MatchesClause;
  (pMVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pMVar6->matchesKeyword).kind = TVar2;
  (pMVar6->matchesKeyword).field_0x2 = uVar3;
  (pMVar6->matchesKeyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pMVar6->matchesKeyword).rawLen = uVar5;
  (pMVar6->matchesKeyword).info = pIVar1;
  (pMVar6->pattern).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pMVar6->super_SyntaxNode;
  return pMVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }